

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O3

uint gf_matr_det(uint **M,uint rows,uint cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  uint **ppuVar5;
  void *pvVar6;
  uint **ppuVar7;
  undefined8 in_RCX;
  long lVar8;
  uint extraout_EDX;
  uint cols_00;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint in_R8D;
  ulong in_R9;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  
  uVar11 = (ulong)rows;
  lVar8 = CONCAT71((int7)((ulong)in_RCX >> 8),rows == 2 || rows == cols);
  if (rows == 2 || rows == cols) {
    uVar11 = (ulong)**M;
    uVar12 = (ulong)M[1][1];
    uVar14 = 0;
    uVar9 = 0;
    if (uVar12 != 0 && uVar11 != 0) {
      uVar9 = index_of[uVar12] + index_of[uVar11];
      uVar3 = (index_of[uVar12] - 0xff) + index_of[uVar11];
      if (uVar9 < 0xff) {
        uVar3 = uVar9;
      }
      uVar9 = alpha_of[uVar3];
    }
    uVar12 = (ulong)*M[1];
    uVar11 = (ulong)(*M)[1];
    if (uVar11 != 0 && uVar12 != 0) {
      uVar14 = index_of[uVar11] + index_of[uVar12];
      uVar3 = (index_of[uVar11] - 0xff) + index_of[uVar12];
      if (uVar14 < 0xff) {
        uVar3 = uVar14;
      }
      uVar14 = alpha_of[uVar3];
    }
    return uVar14 ^ uVar9;
  }
  gf_matr_det_cold_1();
  if (extraout_EDX == in_R8D) {
    ppuVar5 = matrix_new((uint)uVar11,(uint)in_R9);
    if ((uint)uVar11 != 0) {
      uVar12 = 0;
      do {
        if ((uint)in_R9 != 0) {
          puVar1 = ppuVar5[uVar12];
          uVar13 = 0;
          do {
            puVar1[uVar13] = 0;
            if (extraout_EDX != 0) {
              puVar2 = M[uVar12];
              uVar15 = 0;
              uVar9 = 0;
              do {
                uVar14 = 0;
                if ((ulong)puVar2[uVar15] != 0) {
                  uVar3 = *(uint *)(*(long *)(lVar8 + uVar15 * 8) + uVar13 * 4);
                  uVar14 = 0;
                  if (uVar3 != 0) {
                    uVar14 = index_of[uVar3] + index_of[puVar2[uVar15]];
                    uVar3 = (index_of[uVar3] - 0xff) + index_of[puVar2[uVar15]];
                    if (uVar14 < 0xff) {
                      uVar3 = uVar14;
                    }
                    uVar14 = alpha_of[uVar3];
                  }
                }
                uVar9 = uVar9 ^ uVar14;
                puVar1[uVar13] = uVar9;
                uVar15 = uVar15 + 1;
              } while (extraout_EDX != uVar15);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != (in_R9 & 0xffffffff));
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != (uVar11 & 0xffffffff));
    }
    return (uint)ppuVar5;
  }
  gf_matr_mul_cold_1();
  uVar9 = (uint)uVar11;
  if (uVar9 == in_R8D) {
    uVar11 = uVar11 & 0xffffffff;
    pvVar6 = calloc(uVar11,4);
    if (uVar9 != 0) {
      uVar12 = 0;
      do {
        uVar13 = 0;
        uVar9 = 0;
        do {
          uVar14 = 0;
          if (((ulong)M[uVar12][uVar13] != 0) && (uVar3 = *(uint *)(lVar8 + uVar13 * 4), uVar3 != 0)
             ) {
            uVar14 = index_of[uVar3] + index_of[M[uVar12][uVar13]];
            uVar3 = (index_of[uVar3] - 0xff) + index_of[M[uVar12][uVar13]];
            if (uVar14 < 0xff) {
              uVar3 = uVar14;
            }
            uVar14 = alpha_of[uVar3];
          }
          uVar9 = uVar9 ^ uVar14;
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
        *(uint *)((long)pvVar6 + uVar12 * 4) = uVar9;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar11);
    }
    return (uint)pvVar6;
  }
  gf_matr_mul_vector_cold_1();
  if (uVar9 == 2 || uVar9 == cols_00) {
    uVar3 = gf_matr_det(M,uVar9,cols_00);
    ppuVar5 = matrix_copy(M,uVar9,cols_00);
    ppuVar7 = matrix_new(uVar9,cols_00);
    puVar1 = ppuVar5[1];
    uVar14 = **ppuVar5;
    **ppuVar5 = puVar1[1];
    puVar1[1] = uVar14;
    if (uVar9 != 0) {
      uVar11 = 0;
      do {
        if (cols_00 != 0) {
          puVar1 = ppuVar5[uVar11];
          puVar2 = ppuVar7[uVar11];
          uVar12 = 0;
          do {
            uVar13 = (ulong)puVar1[uVar12];
            if (uVar13 != 0 && uVar3 != 0) {
              iVar10 = index_of[uVar13] - index_of[uVar3];
              iVar4 = iVar10 + 0xff;
              if (-1 < iVar10) {
                iVar4 = iVar10;
              }
              uVar14 = alpha_of[iVar4];
            }
            else {
              uVar14 = -(uint)(uVar13 != 0);
            }
            puVar2[uVar12] = uVar14;
            uVar12 = uVar12 + 1;
          } while (cols_00 != uVar12);
        }
        uVar11 = uVar11 + 1;
        uVar14 = cols_00;
      } while (uVar11 != uVar9);
    }
    matrix_free(ppuVar5,uVar9,uVar14);
    return (uint)ppuVar7;
  }
  gf_matr_inv_cold_1();
  test_n = test_n + 1;
  iVar4 = printf("test %d failed\n");
  return (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
}

Assistant:

uint32_t gf_matr_det(uint32_t **M, uint32_t rows, uint32_t cols)
{
    if (rows != cols && rows != 2)
        fatal("gf_det", "only 2x2 matrix\n");

    uint32_t first = gf_mul(M[0][0], M[1][1]);
    uint32_t second = gf_mul(M[1][0], M[0][1]);
    return gf_sum(first, second);
}